

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::compute_split_estimate
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *left_child_res,
          vec<2U,_float> *right_child_res,vq_node *parent_node)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar1;
  undefined8 uVar2;
  float fVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float dist2;
  float fVar11;
  float fVar12;
  float dist2_1;
  
  uVar5 = (ulong)(parent_node->m_vectors).m_size;
  if (uVar5 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    fVar3 = -1.0;
    uVar6 = 0;
    do {
      ppVar1 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar6];
      fVar11 = 0.0;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar7 = bVar4;
        fVar12 = (ppVar1->first).m_s[lVar8] - (parent_node->m_centroid).m_s[lVar8];
        fVar11 = fVar11 + fVar12 * fVar12;
        lVar8 = 1;
        bVar4 = false;
      } while (bVar7);
      if (fVar3 < fVar11) {
        uVar9 = *(undefined8 *)(ppVar1->first).m_s;
        fVar3 = fVar11;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
    if (uVar5 != 0) {
      uVar10 = 0;
      fVar3 = -1.0;
      uVar6 = 0;
      do {
        ppVar1 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar6];
        fVar12 = 0.0;
        lVar8 = 0;
        fVar11 = (float)uVar9;
        bVar4 = true;
        do {
          bVar7 = bVar4;
          fVar11 = (ppVar1->first).m_s[lVar8] - fVar11;
          fVar12 = fVar12 + fVar11 * fVar11;
          lVar8 = 1;
          fVar11 = (float)((ulong)uVar9 >> 0x20);
          bVar4 = false;
        } while (bVar7);
        if (fVar3 < fVar12) {
          uVar10 = *(undefined8 *)(ppVar1->first).m_s;
          fVar3 = fVar12;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar5);
      goto LAB_00144bf6;
    }
  }
  uVar10 = 0;
LAB_00144bf6:
  uVar2 = *(undefined8 *)(parent_node->m_centroid).m_s;
  *(ulong *)left_child_res->m_s =
       CONCAT44(((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar9 >> 0x20)) * 0.5,
                ((float)uVar2 + (float)uVar9) * 0.5);
  uVar9 = *(undefined8 *)(parent_node->m_centroid).m_s;
  *(ulong *)right_child_res->m_s =
       CONCAT44(((float)((ulong)uVar9 >> 0x20) + (float)((ulong)uVar10 >> 0x20)) * 0.5,
                ((float)uVar9 + (float)uVar10) * 0.5);
  return;
}

Assistant:

void compute_split_estimate(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node)
        {
            VectorType furthest(0);
            double furthest_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(parent_node.m_centroid);
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest = v;
                }
            }

            VectorType opposite(0);
            double opposite_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(furthest);
                if (dist > opposite_dist)
                {
                    opposite_dist = dist;
                    opposite = v;
                }
            }

            left_child_res = (furthest + parent_node.m_centroid) * .5f;
            right_child_res = (opposite + parent_node.m_centroid) * .5f;
        }